

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  RTCFilterFunctionN p_Var7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  int iVar22;
  undefined4 uVar23;
  undefined1 (*pauVar24) [16];
  uint uVar25;
  ulong uVar26;
  undefined1 (*pauVar27) [16];
  long lVar28;
  ulong uVar29;
  undefined1 (*pauVar30) [16];
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  undefined1 (*pauVar37) [16];
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar56 [32];
  undefined1 auVar55 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [64];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [64];
  undefined1 auVar94 [32];
  undefined1 auVar95 [64];
  undefined1 auVar96 [16];
  undefined1 auVar97 [64];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [16];
  undefined1 auVar105 [64];
  float fVar106;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar107 [64];
  undefined1 auVar111 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2869;
  ulong local_2868;
  undefined8 local_2860;
  float fStack_2858;
  float fStack_2854;
  undefined1 local_2850 [16];
  undefined1 local_2840 [16];
  undefined1 local_2830 [16];
  undefined1 local_2820 [16];
  undefined1 local_2810 [16];
  Scene *local_2800;
  undefined8 uStack_27f8;
  undefined1 local_27f0 [16];
  size_t local_27d8;
  RayHitK<8> *local_27d0;
  long local_27c8;
  ulong local_27c0;
  ulong local_27b8;
  RTCFilterFunctionNArguments local_27b0;
  undefined1 local_2780 [32];
  float local_2750;
  float fStack_274c;
  float fStack_2748;
  float fStack_2744;
  undefined1 local_2740 [16];
  undefined1 local_2730 [16];
  undefined1 *local_2720;
  undefined1 local_2710 [16];
  undefined1 local_2700 [16];
  undefined1 local_26f0 [16];
  undefined1 local_26e0 [16];
  undefined1 local_26d0 [16];
  undefined1 local_26c0 [16];
  undefined1 local_26b0 [16];
  undefined1 local_26a0 [32];
  undefined1 local_2670 [16];
  undefined1 local_2660 [16];
  undefined1 local_2650 [16];
  undefined1 local_2640 [16];
  undefined1 local_2630 [16];
  undefined1 local_2620 [16];
  undefined1 local_2610 [16];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  RTCHitN local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined4 local_2440;
  undefined4 uStack_243c;
  undefined4 uStack_2438;
  undefined4 uStack_2434;
  undefined4 uStack_2430;
  undefined4 uStack_242c;
  undefined4 uStack_2428;
  undefined4 uStack_2424;
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  uint local_23e0;
  uint uStack_23dc;
  uint uStack_23d8;
  uint uStack_23d4;
  uint uStack_23d0;
  uint uStack_23cc;
  uint uStack_23c8;
  uint uStack_23c4;
  uint local_23c0;
  uint uStack_23bc;
  uint uStack_23b8;
  uint uStack_23b4;
  uint uStack_23b0;
  uint uStack_23ac;
  uint uStack_23a8;
  uint uStack_23a4;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar66 [32];
  
  pauVar24 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar23 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_24e0._4_4_ = uVar23;
  local_24e0._0_4_ = uVar23;
  local_24e0._8_4_ = uVar23;
  local_24e0._12_4_ = uVar23;
  local_24e0._16_4_ = uVar23;
  local_24e0._20_4_ = uVar23;
  local_24e0._24_4_ = uVar23;
  local_24e0._28_4_ = uVar23;
  auVar88 = ZEXT3264(local_24e0);
  uVar23 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2500._4_4_ = uVar23;
  local_2500._0_4_ = uVar23;
  local_2500._8_4_ = uVar23;
  local_2500._12_4_ = uVar23;
  local_2500._16_4_ = uVar23;
  local_2500._20_4_ = uVar23;
  local_2500._24_4_ = uVar23;
  local_2500._28_4_ = uVar23;
  auVar93 = ZEXT3264(local_2500);
  uVar23 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_2520._4_4_ = uVar23;
  local_2520._0_4_ = uVar23;
  local_2520._8_4_ = uVar23;
  local_2520._12_4_ = uVar23;
  local_2520._16_4_ = uVar23;
  local_2520._20_4_ = uVar23;
  local_2520._24_4_ = uVar23;
  local_2520._28_4_ = uVar23;
  auVar95 = ZEXT3264(local_2520);
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar16 = fVar1 * 0.99999964;
  local_2540._4_4_ = fVar16;
  local_2540._0_4_ = fVar16;
  local_2540._8_4_ = fVar16;
  local_2540._12_4_ = fVar16;
  local_2540._16_4_ = fVar16;
  local_2540._20_4_ = fVar16;
  local_2540._24_4_ = fVar16;
  local_2540._28_4_ = fVar16;
  auVar97 = ZEXT3264(local_2540);
  fVar16 = fVar2 * 0.99999964;
  local_2560._4_4_ = fVar16;
  local_2560._0_4_ = fVar16;
  local_2560._8_4_ = fVar16;
  local_2560._12_4_ = fVar16;
  local_2560._16_4_ = fVar16;
  local_2560._20_4_ = fVar16;
  local_2560._24_4_ = fVar16;
  local_2560._28_4_ = fVar16;
  auVar101 = ZEXT3264(local_2560);
  fVar16 = fVar3 * 0.99999964;
  local_2580._4_4_ = fVar16;
  local_2580._0_4_ = fVar16;
  local_2580._8_4_ = fVar16;
  local_2580._12_4_ = fVar16;
  local_2580._16_4_ = fVar16;
  local_2580._20_4_ = fVar16;
  local_2580._24_4_ = fVar16;
  local_2580._28_4_ = fVar16;
  auVar102 = ZEXT3264(local_2580);
  fVar1 = fVar1 * 1.0000004;
  local_25a0._4_4_ = fVar1;
  local_25a0._0_4_ = fVar1;
  local_25a0._8_4_ = fVar1;
  local_25a0._12_4_ = fVar1;
  local_25a0._16_4_ = fVar1;
  local_25a0._20_4_ = fVar1;
  local_25a0._24_4_ = fVar1;
  local_25a0._28_4_ = fVar1;
  auVar103 = ZEXT3264(local_25a0);
  fVar2 = fVar2 * 1.0000004;
  local_25c0._4_4_ = fVar2;
  local_25c0._0_4_ = fVar2;
  local_25c0._8_4_ = fVar2;
  local_25c0._12_4_ = fVar2;
  local_25c0._16_4_ = fVar2;
  local_25c0._20_4_ = fVar2;
  local_25c0._24_4_ = fVar2;
  local_25c0._28_4_ = fVar2;
  auVar105 = ZEXT3264(local_25c0);
  fVar3 = fVar3 * 1.0000004;
  local_25e0._4_4_ = fVar3;
  local_25e0._0_4_ = fVar3;
  local_25e0._8_4_ = fVar3;
  local_25e0._12_4_ = fVar3;
  local_25e0._16_4_ = fVar3;
  local_25e0._20_4_ = fVar3;
  local_25e0._24_4_ = fVar3;
  local_25e0._28_4_ = fVar3;
  auVar107 = ZEXT3264(local_25e0);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_27b8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_27c0 = uVar33 ^ 0x20;
  uVar38 = local_27b8 ^ 0x20;
  iVar22 = (tray->tnear).field_0.i[k];
  local_2780._4_4_ = iVar22;
  local_2780._0_4_ = iVar22;
  local_2780._8_4_ = iVar22;
  local_2780._12_4_ = iVar22;
  local_2780._16_4_ = iVar22;
  local_2780._20_4_ = iVar22;
  local_2780._24_4_ = iVar22;
  local_2780._28_4_ = iVar22;
  auVar111 = ZEXT3264(local_2780);
  iVar22 = (tray->tfar).field_0.i[k];
  auVar46 = ZEXT3264(CONCAT428(iVar22,CONCAT424(iVar22,CONCAT420(iVar22,CONCAT416(iVar22,CONCAT412(
                                                  iVar22,CONCAT48(iVar22,CONCAT44(iVar22,iVar22)))))
                                               )));
  iVar22 = 1 << ((uint)k & 0x1f);
  auVar56._4_4_ = iVar22;
  auVar56._0_4_ = iVar22;
  auVar56._8_4_ = iVar22;
  auVar56._12_4_ = iVar22;
  auVar56._16_4_ = iVar22;
  auVar56._20_4_ = iVar22;
  auVar56._24_4_ = iVar22;
  auVar56._28_4_ = iVar22;
  auVar18 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar56 = vpand_avx2(auVar56,auVar18);
  local_2600 = vpcmpeqd_avx2(auVar56,auVar18);
  local_27d0 = ray;
  local_27d8 = k;
  local_2868 = uVar33;
LAB_00621727:
  do {
    pauVar37 = pauVar24 + -1;
    pauVar24 = pauVar24 + -1;
    if (*(float *)(*pauVar37 + 8) <= *(float *)(ray + k * 4 + 0x100)) {
      uVar29 = *(ulong *)*pauVar24;
      while ((uVar29 & 8) == 0) {
        auVar66 = auVar88._0_32_;
        auVar56 = vsubps_avx(*(undefined1 (*) [32])(uVar29 + 0x40 + uVar33),auVar66);
        auVar18._4_4_ = auVar97._4_4_ * auVar56._4_4_;
        auVar18._0_4_ = auVar97._0_4_ * auVar56._0_4_;
        auVar18._8_4_ = auVar97._8_4_ * auVar56._8_4_;
        auVar18._12_4_ = auVar97._12_4_ * auVar56._12_4_;
        auVar18._16_4_ = auVar97._16_4_ * auVar56._16_4_;
        auVar18._20_4_ = auVar97._20_4_ * auVar56._20_4_;
        auVar18._24_4_ = auVar97._24_4_ * auVar56._24_4_;
        auVar18._28_4_ = auVar56._28_4_;
        auVar57 = auVar93._0_32_;
        auVar56 = vsubps_avx(*(undefined1 (*) [32])(uVar29 + 0x40 + local_27b8),auVar57);
        auVar67._4_4_ = auVar101._4_4_ * auVar56._4_4_;
        auVar67._0_4_ = auVar101._0_4_ * auVar56._0_4_;
        auVar67._8_4_ = auVar101._8_4_ * auVar56._8_4_;
        auVar67._12_4_ = auVar101._12_4_ * auVar56._12_4_;
        auVar67._16_4_ = auVar101._16_4_ * auVar56._16_4_;
        auVar67._20_4_ = auVar101._20_4_ * auVar56._20_4_;
        auVar67._24_4_ = auVar101._24_4_ * auVar56._24_4_;
        auVar67._28_4_ = auVar56._28_4_;
        auVar56 = vmaxps_avx(auVar18,auVar67);
        auVar94 = auVar95._0_32_;
        auVar18 = vsubps_avx(*(undefined1 (*) [32])(uVar29 + 0x40 + uVar36),auVar94);
        auVar17._4_4_ = auVar102._4_4_ * auVar18._4_4_;
        auVar17._0_4_ = auVar102._0_4_ * auVar18._0_4_;
        auVar17._8_4_ = auVar102._8_4_ * auVar18._8_4_;
        auVar17._12_4_ = auVar102._12_4_ * auVar18._12_4_;
        auVar17._16_4_ = auVar102._16_4_ * auVar18._16_4_;
        auVar17._20_4_ = auVar102._20_4_ * auVar18._20_4_;
        auVar17._24_4_ = auVar102._24_4_ * auVar18._24_4_;
        auVar17._28_4_ = auVar18._28_4_;
        auVar18 = vmaxps_avx(auVar17,auVar111._0_32_);
        auVar18 = vmaxps_avx(auVar56,auVar18);
        auVar56 = vsubps_avx(*(undefined1 (*) [32])(uVar29 + 0x40 + local_27c0),auVar66);
        auVar19._4_4_ = auVar103._4_4_ * auVar56._4_4_;
        auVar19._0_4_ = auVar103._0_4_ * auVar56._0_4_;
        auVar19._8_4_ = auVar103._8_4_ * auVar56._8_4_;
        auVar19._12_4_ = auVar103._12_4_ * auVar56._12_4_;
        auVar19._16_4_ = auVar103._16_4_ * auVar56._16_4_;
        auVar19._20_4_ = auVar103._20_4_ * auVar56._20_4_;
        auVar19._24_4_ = auVar103._24_4_ * auVar56._24_4_;
        auVar19._28_4_ = auVar56._28_4_;
        auVar56 = vsubps_avx(*(undefined1 (*) [32])(uVar29 + 0x40 + uVar38),auVar57);
        auVar20._4_4_ = auVar105._4_4_ * auVar56._4_4_;
        auVar20._0_4_ = auVar105._0_4_ * auVar56._0_4_;
        auVar20._8_4_ = auVar105._8_4_ * auVar56._8_4_;
        auVar20._12_4_ = auVar105._12_4_ * auVar56._12_4_;
        auVar20._16_4_ = auVar105._16_4_ * auVar56._16_4_;
        auVar20._20_4_ = auVar105._20_4_ * auVar56._20_4_;
        auVar20._24_4_ = auVar105._24_4_ * auVar56._24_4_;
        auVar20._28_4_ = auVar56._28_4_;
        auVar56 = vminps_avx(auVar19,auVar20);
        auVar67 = vsubps_avx(*(undefined1 (*) [32])(uVar29 + 0x40 + (uVar36 ^ 0x20)),auVar94);
        auVar21._4_4_ = auVar107._4_4_ * auVar67._4_4_;
        auVar21._0_4_ = auVar107._0_4_ * auVar67._0_4_;
        auVar21._8_4_ = auVar107._8_4_ * auVar67._8_4_;
        auVar21._12_4_ = auVar107._12_4_ * auVar67._12_4_;
        auVar21._16_4_ = auVar107._16_4_ * auVar67._16_4_;
        auVar21._20_4_ = auVar107._20_4_ * auVar67._20_4_;
        auVar21._24_4_ = auVar107._24_4_ * auVar67._24_4_;
        auVar21._28_4_ = auVar67._28_4_;
        auVar67 = vminps_avx(auVar21,auVar46._0_32_);
        auVar56 = vminps_avx(auVar56,auVar67);
        auVar56 = vcmpps_avx(auVar18,auVar56,2);
        uVar25 = vmovmskps_avx(auVar56);
        local_24c0[0] = (RTCHitN)auVar18[0];
        local_24c0[1] = (RTCHitN)auVar18[1];
        local_24c0[2] = (RTCHitN)auVar18[2];
        local_24c0[3] = (RTCHitN)auVar18[3];
        local_24c0[4] = (RTCHitN)auVar18[4];
        local_24c0[5] = (RTCHitN)auVar18[5];
        local_24c0[6] = (RTCHitN)auVar18[6];
        local_24c0[7] = (RTCHitN)auVar18[7];
        local_24c0[8] = (RTCHitN)auVar18[8];
        local_24c0[9] = (RTCHitN)auVar18[9];
        local_24c0[10] = (RTCHitN)auVar18[10];
        local_24c0[0xb] = (RTCHitN)auVar18[0xb];
        local_24c0[0xc] = (RTCHitN)auVar18[0xc];
        local_24c0[0xd] = (RTCHitN)auVar18[0xd];
        local_24c0[0xe] = (RTCHitN)auVar18[0xe];
        local_24c0[0xf] = (RTCHitN)auVar18[0xf];
        local_24c0[0x10] = (RTCHitN)auVar18[0x10];
        local_24c0[0x11] = (RTCHitN)auVar18[0x11];
        local_24c0[0x12] = (RTCHitN)auVar18[0x12];
        local_24c0[0x13] = (RTCHitN)auVar18[0x13];
        local_24c0[0x14] = (RTCHitN)auVar18[0x14];
        local_24c0[0x15] = (RTCHitN)auVar18[0x15];
        local_24c0[0x16] = (RTCHitN)auVar18[0x16];
        local_24c0[0x17] = (RTCHitN)auVar18[0x17];
        local_24c0[0x18] = (RTCHitN)auVar18[0x18];
        local_24c0[0x19] = (RTCHitN)auVar18[0x19];
        local_24c0[0x1a] = (RTCHitN)auVar18[0x1a];
        local_24c0[0x1b] = (RTCHitN)auVar18[0x1b];
        local_24c0[0x1c] = (RTCHitN)auVar18[0x1c];
        local_24c0[0x1d] = (RTCHitN)auVar18[0x1d];
        local_24c0[0x1e] = (RTCHitN)auVar18[0x1e];
        local_24c0[0x1f] = (RTCHitN)auVar18[0x1f];
        if (uVar25 == 0) {
          if (pauVar24 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          goto LAB_00621727;
        }
        uVar25 = uVar25 & 0xff;
        uVar34 = uVar29 & 0xfffffffffffffff0;
        lVar35 = 0;
        for (uVar29 = (ulong)uVar25; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
          lVar35 = lVar35 + 1;
        }
        uVar29 = *(ulong *)(uVar34 + lVar35 * 8);
        uVar25 = uVar25 - 1 & uVar25;
        uVar26 = (ulong)uVar25;
        if (uVar25 != 0) {
          uVar5 = *(uint *)(local_24c0 + lVar35 * 4);
          lVar35 = 0;
          for (; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
            lVar35 = lVar35 + 1;
          }
          uVar25 = uVar25 - 1 & uVar25;
          uVar31 = (ulong)uVar25;
          uVar26 = *(ulong *)(uVar34 + lVar35 * 8);
          uVar6 = *(uint *)(local_24c0 + lVar35 * 4);
          uVar33 = local_2868;
          if (uVar25 == 0) {
            if (uVar5 < uVar6) {
              *(ulong *)*pauVar24 = uVar26;
              *(uint *)(*pauVar24 + 8) = uVar6;
              pauVar24 = pauVar24 + 1;
            }
            else {
              *(ulong *)*pauVar24 = uVar29;
              *(uint *)(*pauVar24 + 8) = uVar5;
              pauVar24 = pauVar24 + 1;
              uVar29 = uVar26;
            }
          }
          else {
            auVar47._8_8_ = 0;
            auVar47._0_8_ = uVar29;
            auVar47 = vpunpcklqdq_avx(auVar47,ZEXT416(uVar5));
            auVar58._8_8_ = 0;
            auVar58._0_8_ = uVar26;
            auVar58 = vpunpcklqdq_avx(auVar58,ZEXT416(uVar6));
            lVar35 = 0;
            for (; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
              lVar35 = lVar35 + 1;
            }
            uVar25 = uVar25 - 1 & uVar25;
            uVar29 = (ulong)uVar25;
            auVar68._8_8_ = 0;
            auVar68._0_8_ = *(ulong *)(uVar34 + lVar35 * 8);
            auVar48 = vpunpcklqdq_avx(auVar68,ZEXT416(*(uint *)(local_24c0 + lVar35 * 4)));
            auVar68 = vpcmpgtd_avx(auVar58,auVar47);
            if (uVar25 == 0) {
              auVar78 = vpshufd_avx(auVar68,0xaa);
              auVar68 = vblendvps_avx(auVar58,auVar47,auVar78);
              auVar47 = vblendvps_avx(auVar47,auVar58,auVar78);
              auVar58 = vpcmpgtd_avx(auVar48,auVar68);
              auVar78 = vpshufd_avx(auVar58,0xaa);
              auVar58 = vblendvps_avx(auVar48,auVar68,auVar78);
              auVar68 = vblendvps_avx(auVar68,auVar48,auVar78);
              auVar48 = vpcmpgtd_avx(auVar68,auVar47);
              auVar78 = vpshufd_avx(auVar48,0xaa);
              auVar48 = vblendvps_avx(auVar68,auVar47,auVar78);
              auVar47 = vblendvps_avx(auVar47,auVar68,auVar78);
              *pauVar24 = auVar47;
              pauVar24[1] = auVar48;
              uVar29 = auVar58._0_8_;
              pauVar24 = pauVar24 + 2;
            }
            else {
              lVar35 = 0;
              for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
                lVar35 = lVar35 + 1;
              }
              uVar25 = uVar25 - 1 & uVar25;
              uVar26 = (ulong)uVar25;
              auVar78._8_8_ = 0;
              auVar78._0_8_ = *(ulong *)(uVar34 + lVar35 * 8);
              auVar78 = vpunpcklqdq_avx(auVar78,ZEXT416(*(uint *)(local_24c0 + lVar35 * 4)));
              if (uVar25 == 0) {
                auVar39 = vpshufd_avx(auVar68,0xaa);
                auVar68 = vblendvps_avx(auVar58,auVar47,auVar39);
                auVar47 = vblendvps_avx(auVar47,auVar58,auVar39);
                auVar58 = vpcmpgtd_avx(auVar78,auVar48);
                auVar39 = vpshufd_avx(auVar58,0xaa);
                auVar58 = vblendvps_avx(auVar78,auVar48,auVar39);
                auVar48 = vblendvps_avx(auVar48,auVar78,auVar39);
                auVar78 = vpcmpgtd_avx(auVar48,auVar47);
                auVar39 = vpshufd_avx(auVar78,0xaa);
                auVar78 = vblendvps_avx(auVar48,auVar47,auVar39);
                auVar47 = vblendvps_avx(auVar47,auVar48,auVar39);
                auVar48 = vpcmpgtd_avx(auVar58,auVar68);
                auVar39 = vpshufd_avx(auVar48,0xaa);
                auVar48 = vblendvps_avx(auVar58,auVar68,auVar39);
                auVar58 = vblendvps_avx(auVar68,auVar58,auVar39);
                auVar68 = vpcmpgtd_avx(auVar78,auVar58);
                auVar39 = vpshufd_avx(auVar68,0xaa);
                auVar68 = vblendvps_avx(auVar78,auVar58,auVar39);
                auVar58 = vblendvps_avx(auVar58,auVar78,auVar39);
                *pauVar24 = auVar47;
                pauVar24[1] = auVar58;
                pauVar24[2] = auVar68;
                uVar29 = auVar48._0_8_;
                pauVar37 = pauVar24 + 3;
              }
              else {
                *pauVar24 = auVar47;
                pauVar24[1] = auVar58;
                pauVar24[2] = auVar48;
                pauVar24[3] = auVar78;
                lVar35 = 0x30;
                do {
                  lVar28 = lVar35;
                  lVar35 = 0;
                  for (uVar29 = uVar26; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000
                      ) {
                    lVar35 = lVar35 + 1;
                  }
                  uVar29 = *(ulong *)(uVar34 + lVar35 * 8);
                  auVar48._8_8_ = 0;
                  auVar48._0_8_ = uVar29;
                  auVar47 = vpunpcklqdq_avx(auVar48,ZEXT416(*(uint *)(local_24c0 + lVar35 * 4)));
                  *(undefined1 (*) [16])(pauVar24[1] + lVar28) = auVar47;
                  uVar26 = uVar26 - 1 & uVar26;
                  lVar35 = lVar28 + 0x10;
                } while (uVar26 != 0);
                pauVar37 = (undefined1 (*) [16])(pauVar24[1] + lVar28);
                if (lVar28 + 0x10 != 0) {
                  lVar35 = 0x10;
                  pauVar27 = pauVar24;
                  do {
                    auVar47 = pauVar27[1];
                    pauVar27 = pauVar27 + 1;
                    uVar25 = vextractps_avx(auVar47,2);
                    lVar28 = lVar35;
                    do {
                      if (uVar25 <= *(uint *)(pauVar24[-1] + lVar28 + 8)) {
                        pauVar30 = (undefined1 (*) [16])(*pauVar24 + lVar28);
                        break;
                      }
                      *(undefined1 (*) [16])(*pauVar24 + lVar28) =
                           *(undefined1 (*) [16])(pauVar24[-1] + lVar28);
                      lVar28 = lVar28 + -0x10;
                      pauVar30 = pauVar24;
                    } while (lVar28 != 0);
                    *pauVar30 = auVar47;
                    lVar35 = lVar35 + 0x10;
                  } while (pauVar37 != pauVar27);
                  uVar29 = *(ulong *)*pauVar37;
                }
              }
              auVar88 = ZEXT3264(auVar66);
              auVar93 = ZEXT3264(auVar57);
              auVar95 = ZEXT3264(auVar94);
              auVar97 = ZEXT3264(auVar97._0_32_);
              auVar101 = ZEXT3264(auVar101._0_32_);
              auVar102 = ZEXT3264(auVar102._0_32_);
              auVar103 = ZEXT3264(auVar103._0_32_);
              auVar105 = ZEXT3264(auVar105._0_32_);
              auVar107 = ZEXT3264(auVar107._0_32_);
              auVar111 = ZEXT3264(local_2780);
              pauVar24 = pauVar37;
            }
          }
        }
      }
      local_27c8 = (ulong)((uint)uVar29 & 0xf) - 8;
      if (local_27c8 != 0) {
        uVar29 = uVar29 & 0xfffffffffffffff0;
        lVar35 = 0;
        do {
          local_2720 = &local_2869;
          lVar28 = lVar35 * 0xb0;
          uVar23 = *(undefined4 *)(ray + k * 4);
          auVar39._4_4_ = uVar23;
          auVar39._0_4_ = uVar23;
          auVar39._8_4_ = uVar23;
          auVar39._12_4_ = uVar23;
          uVar23 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar59._4_4_ = uVar23;
          auVar59._0_4_ = uVar23;
          auVar59._8_4_ = uVar23;
          auVar59._12_4_ = uVar23;
          uVar23 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar69._4_4_ = uVar23;
          auVar69._0_4_ = uVar23;
          auVar69._8_4_ = uVar23;
          auVar69._12_4_ = uVar23;
          local_2810 = vsubps_avx(*(undefined1 (*) [16])(uVar29 + lVar28),auVar39);
          local_2820 = vsubps_avx(*(undefined1 (*) [16])(uVar29 + 0x10 + lVar28),auVar59);
          auVar47 = vsubps_avx(*(undefined1 (*) [16])(uVar29 + 0x20 + lVar28),auVar69);
          auVar58 = vsubps_avx(*(undefined1 (*) [16])(uVar29 + 0x30 + lVar28),auVar39);
          auVar68 = vsubps_avx(*(undefined1 (*) [16])(uVar29 + 0x40 + lVar28),auVar59);
          auVar48 = vsubps_avx(*(undefined1 (*) [16])(uVar29 + 0x50 + lVar28),auVar69);
          auVar78 = vsubps_avx(*(undefined1 (*) [16])(uVar29 + 0x60 + lVar28),auVar39);
          auVar39 = vsubps_avx(*(undefined1 (*) [16])(uVar29 + 0x70 + lVar28),auVar59);
          auVar50 = vsubps_avx(*(undefined1 (*) [16])(uVar29 + 0x80 + lVar28),auVar69);
          auVar59 = vsubps_avx(auVar78,local_2810);
          local_2620 = vsubps_avx(auVar39,local_2820);
          local_2610 = vsubps_avx(auVar50,auVar47);
          auVar40._0_4_ = local_2810._0_4_ + auVar78._0_4_;
          auVar40._4_4_ = local_2810._4_4_ + auVar78._4_4_;
          auVar40._8_4_ = local_2810._8_4_ + auVar78._8_4_;
          auVar40._12_4_ = local_2810._12_4_ + auVar78._12_4_;
          auVar70._0_4_ = local_2820._0_4_ + auVar39._0_4_;
          auVar70._4_4_ = local_2820._4_4_ + auVar39._4_4_;
          auVar70._8_4_ = local_2820._8_4_ + auVar39._8_4_;
          auVar70._12_4_ = local_2820._12_4_ + auVar39._12_4_;
          fVar106 = auVar47._0_4_;
          auVar73._0_4_ = fVar106 + auVar50._0_4_;
          fVar108 = auVar47._4_4_;
          auVar73._4_4_ = fVar108 + auVar50._4_4_;
          fVar109 = auVar47._8_4_;
          auVar73._8_4_ = fVar109 + auVar50._8_4_;
          fVar110 = auVar47._12_4_;
          auVar73._12_4_ = fVar110 + auVar50._12_4_;
          auVar104._0_4_ = local_2610._0_4_ * auVar70._0_4_;
          auVar104._4_4_ = local_2610._4_4_ * auVar70._4_4_;
          auVar104._8_4_ = local_2610._8_4_ * auVar70._8_4_;
          auVar104._12_4_ = local_2610._12_4_ * auVar70._12_4_;
          auVar49 = vfmsub231ps_fma(auVar104,local_2620,auVar73);
          auVar74._0_4_ = auVar73._0_4_ * auVar59._0_4_;
          auVar74._4_4_ = auVar73._4_4_ * auVar59._4_4_;
          auVar74._8_4_ = auVar73._8_4_ * auVar59._8_4_;
          auVar74._12_4_ = auVar73._12_4_ * auVar59._12_4_;
          auVar69 = vfmsub231ps_fma(auVar74,local_2610,auVar40);
          auVar41._0_4_ = local_2620._0_4_ * auVar40._0_4_;
          auVar41._4_4_ = local_2620._4_4_ * auVar40._4_4_;
          auVar41._8_4_ = local_2620._8_4_ * auVar40._8_4_;
          auVar41._12_4_ = local_2620._12_4_ * auVar40._12_4_;
          auVar40 = vfmsub231ps_fma(auVar41,auVar59,auVar70);
          local_2860._4_4_ = *(float *)(ray + k * 4 + 0xc0);
          auVar71._0_4_ = local_2860._4_4_ * auVar40._0_4_;
          auVar71._4_4_ = local_2860._4_4_ * auVar40._4_4_;
          auVar71._8_4_ = local_2860._4_4_ * auVar40._8_4_;
          auVar71._12_4_ = local_2860._4_4_ * auVar40._12_4_;
          uVar23 = *(undefined4 *)(ray + k * 4 + 0xa0);
          auVar96._4_4_ = uVar23;
          auVar96._0_4_ = uVar23;
          auVar96._8_4_ = uVar23;
          auVar96._12_4_ = uVar23;
          auVar69 = vfmadd231ps_fma(auVar71,auVar96,auVar69);
          uVar23 = *(undefined4 *)(ray + k * 4 + 0x80);
          local_2850._4_4_ = uVar23;
          local_2850._0_4_ = uVar23;
          local_2850._8_4_ = uVar23;
          local_2850._12_4_ = uVar23;
          local_2660 = vfmadd231ps_fma(auVar69,local_2850,auVar49);
          local_2630 = vsubps_avx(local_2820,auVar68);
          local_2640 = vsubps_avx(auVar47,auVar48);
          auVar79._0_4_ = auVar68._0_4_ + local_2820._0_4_;
          auVar79._4_4_ = auVar68._4_4_ + local_2820._4_4_;
          auVar79._8_4_ = auVar68._8_4_ + local_2820._8_4_;
          auVar79._12_4_ = auVar68._12_4_ + local_2820._12_4_;
          auVar75._0_4_ = fVar106 + auVar48._0_4_;
          auVar75._4_4_ = fVar108 + auVar48._4_4_;
          auVar75._8_4_ = fVar109 + auVar48._8_4_;
          auVar75._12_4_ = fVar110 + auVar48._12_4_;
          fVar1 = local_2640._0_4_;
          auVar82._0_4_ = auVar79._0_4_ * fVar1;
          fVar16 = local_2640._4_4_;
          auVar82._4_4_ = auVar79._4_4_ * fVar16;
          fVar10 = local_2640._8_4_;
          auVar82._8_4_ = auVar79._8_4_ * fVar10;
          fVar13 = local_2640._12_4_;
          auVar82._12_4_ = auVar79._12_4_ * fVar13;
          auVar69 = vfmsub231ps_fma(auVar82,local_2630,auVar75);
          local_2650 = vsubps_avx(local_2810,auVar58);
          fVar2 = local_2650._0_4_;
          auVar89._0_4_ = auVar75._0_4_ * fVar2;
          fVar8 = local_2650._4_4_;
          auVar89._4_4_ = auVar75._4_4_ * fVar8;
          fVar11 = local_2650._8_4_;
          auVar89._8_4_ = auVar75._8_4_ * fVar11;
          fVar14 = local_2650._12_4_;
          auVar89._12_4_ = auVar75._12_4_ * fVar14;
          auVar76._0_4_ = local_2810._0_4_ + auVar58._0_4_;
          auVar76._4_4_ = local_2810._4_4_ + auVar58._4_4_;
          auVar76._8_4_ = local_2810._8_4_ + auVar58._8_4_;
          auVar76._12_4_ = local_2810._12_4_ + auVar58._12_4_;
          auVar47 = vfmsub231ps_fma(auVar89,local_2640,auVar76);
          fVar3 = local_2630._0_4_;
          auVar77._0_4_ = auVar76._0_4_ * fVar3;
          fVar9 = local_2630._4_4_;
          auVar77._4_4_ = auVar76._4_4_ * fVar9;
          fVar12 = local_2630._8_4_;
          auVar77._8_4_ = auVar76._8_4_ * fVar12;
          fVar15 = local_2630._12_4_;
          auVar77._12_4_ = auVar76._12_4_ * fVar15;
          auVar49 = vfmsub231ps_fma(auVar77,local_2650,auVar79);
          auVar42._0_4_ = local_2860._4_4_ * auVar49._0_4_;
          auVar42._4_4_ = local_2860._4_4_ * auVar49._4_4_;
          auVar42._8_4_ = local_2860._4_4_ * auVar49._8_4_;
          auVar42._12_4_ = local_2860._4_4_ * auVar49._12_4_;
          auVar47 = vfmadd231ps_fma(auVar42,auVar96,auVar47);
          local_2740 = vfmadd231ps_fma(auVar47,local_2850,auVar69);
          auVar69 = vsubps_avx(auVar58,auVar78);
          auVar83._0_4_ = auVar58._0_4_ + auVar78._0_4_;
          auVar83._4_4_ = auVar58._4_4_ + auVar78._4_4_;
          auVar83._8_4_ = auVar58._8_4_ + auVar78._8_4_;
          auVar83._12_4_ = auVar58._12_4_ + auVar78._12_4_;
          auVar78 = vsubps_avx(auVar68,auVar39);
          auVar60._0_4_ = auVar68._0_4_ + auVar39._0_4_;
          auVar60._4_4_ = auVar68._4_4_ + auVar39._4_4_;
          auVar60._8_4_ = auVar68._8_4_ + auVar39._8_4_;
          auVar60._12_4_ = auVar68._12_4_ + auVar39._12_4_;
          auVar68 = vsubps_avx(auVar48,auVar50);
          auVar49._0_4_ = auVar48._0_4_ + auVar50._0_4_;
          auVar49._4_4_ = auVar48._4_4_ + auVar50._4_4_;
          auVar49._8_4_ = auVar48._8_4_ + auVar50._8_4_;
          auVar49._12_4_ = auVar48._12_4_ + auVar50._12_4_;
          auVar80._0_4_ = auVar68._0_4_ * auVar60._0_4_;
          auVar80._4_4_ = auVar68._4_4_ * auVar60._4_4_;
          auVar80._8_4_ = auVar68._8_4_ * auVar60._8_4_;
          auVar80._12_4_ = auVar68._12_4_ * auVar60._12_4_;
          auVar58 = vfmsub231ps_fma(auVar80,auVar78,auVar49);
          auVar50._0_4_ = auVar49._0_4_ * auVar69._0_4_;
          auVar50._4_4_ = auVar49._4_4_ * auVar69._4_4_;
          auVar50._8_4_ = auVar49._8_4_ * auVar69._8_4_;
          auVar50._12_4_ = auVar49._12_4_ * auVar69._12_4_;
          auVar47 = vfmsub231ps_fma(auVar50,auVar68,auVar83);
          auVar84._0_4_ = auVar78._0_4_ * auVar83._0_4_;
          auVar84._4_4_ = auVar78._4_4_ * auVar83._4_4_;
          auVar84._8_4_ = auVar78._8_4_ * auVar83._8_4_;
          auVar84._12_4_ = auVar78._12_4_ * auVar83._12_4_;
          auVar48 = vfmsub231ps_fma(auVar84,auVar69,auVar60);
          local_2860._0_4_ = local_2860._4_4_;
          fStack_2858 = local_2860._4_4_;
          fStack_2854 = local_2860._4_4_;
          auVar61._0_4_ = local_2860._4_4_ * auVar48._0_4_;
          auVar61._4_4_ = local_2860._4_4_ * auVar48._4_4_;
          auVar61._8_4_ = local_2860._4_4_ * auVar48._8_4_;
          auVar61._12_4_ = local_2860._4_4_ * auVar48._12_4_;
          auVar47 = vfmadd231ps_fma(auVar61,auVar96,auVar47);
          auVar48 = vfmadd231ps_fma(auVar47,local_2850,auVar58);
          local_2750 = local_2660._0_4_;
          fStack_274c = local_2660._4_4_;
          fStack_2748 = local_2660._8_4_;
          fStack_2744 = local_2660._12_4_;
          local_2730._0_4_ = auVar48._0_4_ + local_2740._0_4_ + local_2750;
          local_2730._4_4_ = auVar48._4_4_ + local_2740._4_4_ + fStack_274c;
          local_2730._8_4_ = auVar48._8_4_ + local_2740._8_4_ + fStack_2748;
          local_2730._12_4_ = auVar48._12_4_ + local_2740._12_4_ + fStack_2744;
          auVar81._8_4_ = 0x7fffffff;
          auVar81._0_8_ = 0x7fffffff7fffffff;
          auVar81._12_4_ = 0x7fffffff;
          auVar47 = vminps_avx(local_2660,local_2740);
          auVar47 = vminps_avx(auVar47,auVar48);
          local_2670 = vandps_avx(local_2730,auVar81);
          auVar90._0_4_ = local_2670._0_4_ * 1.1920929e-07;
          auVar90._4_4_ = local_2670._4_4_ * 1.1920929e-07;
          auVar90._8_4_ = local_2670._8_4_ * 1.1920929e-07;
          auVar90._12_4_ = local_2670._12_4_ * 1.1920929e-07;
          uVar34 = CONCAT44(auVar90._4_4_,auVar90._0_4_);
          auVar85._0_8_ = uVar34 ^ 0x8000000080000000;
          auVar85._8_4_ = -auVar90._8_4_;
          auVar85._12_4_ = -auVar90._12_4_;
          auVar47 = vcmpps_avx(auVar47,auVar85,5);
          auVar58 = vmaxps_avx(local_2660,local_2740);
          auVar58 = vmaxps_avx(auVar58,auVar48);
          auVar58 = vcmpps_avx(auVar58,auVar90,2);
          auVar47 = vorps_avx(auVar47,auVar58);
          if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar47[0xf] < '\0') {
            auVar62._0_4_ = fVar3 * local_2610._0_4_;
            auVar62._4_4_ = fVar9 * local_2610._4_4_;
            auVar62._8_4_ = fVar12 * local_2610._8_4_;
            auVar62._12_4_ = fVar15 * local_2610._12_4_;
            auVar86._0_4_ = fVar2 * local_2620._0_4_;
            auVar86._4_4_ = fVar8 * local_2620._4_4_;
            auVar86._8_4_ = fVar11 * local_2620._8_4_;
            auVar86._12_4_ = fVar14 * local_2620._12_4_;
            auVar48 = vfmsub213ps_fma(local_2620,local_2640,auVar62);
            auVar91._0_4_ = auVar78._0_4_ * fVar1;
            auVar91._4_4_ = auVar78._4_4_ * fVar16;
            auVar91._8_4_ = auVar78._8_4_ * fVar10;
            auVar91._12_4_ = auVar78._12_4_ * fVar13;
            auVar51._0_4_ = fVar2 * auVar68._0_4_;
            auVar51._4_4_ = fVar8 * auVar68._4_4_;
            auVar51._8_4_ = fVar11 * auVar68._8_4_;
            auVar51._12_4_ = fVar14 * auVar68._12_4_;
            auVar39 = vfmsub213ps_fma(auVar68,local_2630,auVar91);
            auVar58 = vandps_avx(auVar62,auVar81);
            auVar68 = vandps_avx(auVar91,auVar81);
            auVar58 = vcmpps_avx(auVar58,auVar68,1);
            local_26d0 = vblendvps_avx(auVar39,auVar48,auVar58);
            auVar92._0_4_ = fVar3 * auVar69._0_4_;
            auVar92._4_4_ = fVar9 * auVar69._4_4_;
            auVar92._8_4_ = fVar12 * auVar69._8_4_;
            auVar92._12_4_ = fVar15 * auVar69._12_4_;
            auVar48 = vfmsub213ps_fma(auVar69,local_2640,auVar51);
            auVar98._0_4_ = auVar59._0_4_ * fVar1;
            auVar98._4_4_ = auVar59._4_4_ * fVar16;
            auVar98._8_4_ = auVar59._8_4_ * fVar10;
            auVar98._12_4_ = auVar59._12_4_ * fVar13;
            auVar39 = vfmsub213ps_fma(local_2610,local_2650,auVar98);
            auVar58 = vandps_avx(auVar98,auVar81);
            auVar68 = vandps_avx(auVar51,auVar81);
            auVar58 = vcmpps_avx(auVar58,auVar68,1);
            local_26c0 = vblendvps_avx(auVar48,auVar39,auVar58);
            auVar48 = vfmsub213ps_fma(auVar59,local_2630,auVar86);
            auVar78 = vfmsub213ps_fma(auVar78,local_2650,auVar92);
            auVar58 = vandps_avx(auVar86,auVar81);
            auVar68 = vandps_avx(auVar92,auVar81);
            auVar58 = vcmpps_avx(auVar58,auVar68,1);
            local_26b0 = vblendvps_avx(auVar78,auVar48,auVar58);
            auVar52._0_4_ = local_26b0._0_4_ * local_2860._4_4_;
            auVar52._4_4_ = local_26b0._4_4_ * local_2860._4_4_;
            auVar52._8_4_ = local_26b0._8_4_ * local_2860._4_4_;
            auVar52._12_4_ = local_26b0._12_4_ * local_2860._4_4_;
            auVar58 = vfmadd213ps_fma(auVar96,local_26c0,auVar52);
            auVar58 = vfmadd213ps_fma(local_2850,local_26d0,auVar58);
            auVar87._0_4_ = auVar58._0_4_ + auVar58._0_4_;
            auVar87._4_4_ = auVar58._4_4_ + auVar58._4_4_;
            auVar87._8_4_ = auVar58._8_4_ + auVar58._8_4_;
            auVar87._12_4_ = auVar58._12_4_ + auVar58._12_4_;
            auVar53._0_4_ = local_26b0._0_4_ * fVar106;
            auVar53._4_4_ = local_26b0._4_4_ * fVar108;
            auVar53._8_4_ = local_26b0._8_4_ * fVar109;
            auVar53._12_4_ = local_26b0._12_4_ * fVar110;
            auVar58 = vfmadd213ps_fma(local_2820,local_26c0,auVar53);
            auVar68 = vfmadd213ps_fma(local_2810,local_26d0,auVar58);
            auVar58 = vrcpps_avx(auVar87);
            auVar99._8_4_ = 0x3f800000;
            auVar99._0_8_ = 0x3f8000003f800000;
            auVar99._12_4_ = 0x3f800000;
            auVar48 = vfnmadd213ps_fma(auVar58,auVar87,auVar99);
            auVar58 = vfmadd132ps_fma(auVar48,auVar58,auVar58);
            local_26e0._0_4_ = auVar58._0_4_ * (auVar68._0_4_ + auVar68._0_4_);
            local_26e0._4_4_ = auVar58._4_4_ * (auVar68._4_4_ + auVar68._4_4_);
            local_26e0._8_4_ = auVar58._8_4_ * (auVar68._8_4_ + auVar68._8_4_);
            local_26e0._12_4_ = auVar58._12_4_ * (auVar68._12_4_ + auVar68._12_4_);
            auVar88 = ZEXT1664(local_26e0);
            uVar23 = *(undefined4 *)(ray + k * 4 + 0x60);
            auVar54._4_4_ = uVar23;
            auVar54._0_4_ = uVar23;
            auVar54._8_4_ = uVar23;
            auVar54._12_4_ = uVar23;
            auVar58 = vcmpps_avx(auVar54,local_26e0,2);
            uVar23 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar100._4_4_ = uVar23;
            auVar100._0_4_ = uVar23;
            auVar100._8_4_ = uVar23;
            auVar100._12_4_ = uVar23;
            auVar93 = ZEXT1664(auVar100);
            auVar68 = vcmpps_avx(local_26e0,auVar100,2);
            auVar58 = vandps_avx(auVar58,auVar68);
            auVar68 = auVar47 & auVar58;
            if ((((auVar68 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar68 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar68 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar68[0xf] < '\0') {
              auVar58 = vandps_avx(auVar58,auVar47);
              auVar68 = vcmpps_avx(auVar87,_DAT_01f7aa10,4);
              auVar48 = auVar68 & auVar58;
              if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar48[0xf] < '\0') {
                local_27f0 = vandps_avx(auVar58,auVar68);
                uStack_27f8 = auVar47._8_8_;
                local_2800 = context->scene;
                auVar47 = vrcpps_avx(local_2730);
                auVar72._8_4_ = 0x3f800000;
                auVar72._0_8_ = 0x3f8000003f800000;
                auVar72._12_4_ = 0x3f800000;
                auVar58 = vfnmadd213ps_fma(local_2730,auVar47,auVar72);
                auVar58 = vfmadd132ps_fma(auVar58,auVar47,auVar47);
                auVar63._8_4_ = 0x219392ef;
                auVar63._0_8_ = 0x219392ef219392ef;
                auVar63._12_4_ = 0x219392ef;
                auVar47 = vcmpps_avx(local_2670,auVar63,5);
                auVar47 = vandps_avx(auVar58,auVar47);
                auVar43._0_4_ = local_2750 * auVar47._0_4_;
                auVar43._4_4_ = fStack_274c * auVar47._4_4_;
                auVar43._8_4_ = fStack_2748 * auVar47._8_4_;
                auVar43._12_4_ = fStack_2744 * auVar47._12_4_;
                local_2700 = vminps_avx(auVar43,auVar72);
                auVar44._0_4_ = local_2740._0_4_ * auVar47._0_4_;
                auVar44._4_4_ = local_2740._4_4_ * auVar47._4_4_;
                auVar44._8_4_ = local_2740._8_4_ * auVar47._8_4_;
                auVar44._12_4_ = local_2740._12_4_ * auVar47._12_4_;
                local_26f0 = vminps_avx(auVar44,auVar72);
                auVar64._8_4_ = 0x7f800000;
                auVar64._0_8_ = 0x7f8000007f800000;
                auVar64._12_4_ = 0x7f800000;
                auVar47 = vblendvps_avx(auVar64,local_26e0,local_27f0);
                auVar58 = vshufps_avx(auVar47,auVar47,0xb1);
                auVar58 = vminps_avx(auVar58,auVar47);
                auVar68 = vshufpd_avx(auVar58,auVar58,1);
                auVar58 = vminps_avx(auVar68,auVar58);
                auVar47 = vcmpps_avx(auVar47,auVar58,0);
                auVar68 = local_27f0 & auVar47;
                auVar58 = vpcmpeqd_avx(auVar58,auVar58);
                if ((((auVar68 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar68 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar68 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar68[0xf] < '\0') {
                  auVar58 = auVar47;
                }
                lVar28 = lVar28 + uVar29;
                auVar47 = vandps_avx(local_27f0,auVar58);
                uVar23 = vmovmskps_avx(auVar47);
                lVar32 = 0;
                for (uVar34 = CONCAT44((int)((ulong)context->scene >> 0x20),uVar23);
                    (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
                  lVar32 = lVar32 + 1;
                }
                local_2860 = lVar28;
                local_2710 = local_27f0;
                do {
                  uVar25 = *(uint *)(lVar28 + 0x90 + lVar32 * 4);
                  uVar34 = (ulong)uVar25;
                  lVar28 = *(long *)(*(long *)((long)local_2800 + 0x1e8) + uVar34 * 8);
                  local_2850._0_8_ = lVar28;
                  if ((*(uint *)(lVar28 + 0x34) & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                    *(undefined4 *)(local_27f0 + lVar32 * 4) = 0;
                    lVar28 = local_2860;
                  }
                  else {
                    local_2810._0_8_ = lVar32;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (*(long *)(lVar28 + 0x40) == 0)) {
                      uVar23 = *(undefined4 *)(local_2700 + lVar32 * 4);
                      uVar4 = *(undefined4 *)(local_26f0 + lVar32 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_26e0 + lVar32 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x180) =
                           *(undefined4 *)(local_26d0 + lVar32 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) =
                           *(undefined4 *)(local_26c0 + lVar32 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x1c0) =
                           *(undefined4 *)(local_26b0 + lVar32 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar23;
                      *(undefined4 *)(ray + k * 4 + 0x200) = uVar4;
                      *(undefined4 *)(ray + k * 4 + 0x220) =
                           *(undefined4 *)(local_2860 + 0xa0 + lVar32 * 4);
                      *(uint *)(ray + k * 4 + 0x240) = uVar25;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    uVar23 = *(undefined4 *)(local_2700 + lVar32 * 4);
                    local_2460._4_4_ = uVar23;
                    local_2460._0_4_ = uVar23;
                    local_2460._8_4_ = uVar23;
                    local_2460._12_4_ = uVar23;
                    local_2460._16_4_ = uVar23;
                    local_2460._20_4_ = uVar23;
                    local_2460._24_4_ = uVar23;
                    local_2460._28_4_ = uVar23;
                    local_2440 = *(undefined4 *)(local_26f0 + lVar32 * 4);
                    uVar23 = *(undefined4 *)(local_2860 + 0xa0 + lVar32 * 4);
                    local_2420._4_4_ = uVar23;
                    local_2420._0_4_ = uVar23;
                    local_2420._8_4_ = uVar23;
                    local_2420._12_4_ = uVar23;
                    local_2420._16_4_ = uVar23;
                    local_2420._20_4_ = uVar23;
                    local_2420._24_4_ = uVar23;
                    local_2420._28_4_ = uVar23;
                    uVar23 = *(undefined4 *)(local_26d0 + lVar32 * 4);
                    uVar4 = *(undefined4 *)(local_26c0 + lVar32 * 4);
                    local_24a0._4_4_ = uVar4;
                    local_24a0._0_4_ = uVar4;
                    local_24a0._8_4_ = uVar4;
                    local_24a0._12_4_ = uVar4;
                    local_24a0._16_4_ = uVar4;
                    local_24a0._20_4_ = uVar4;
                    local_24a0._24_4_ = uVar4;
                    local_24a0._28_4_ = uVar4;
                    uVar4 = *(undefined4 *)(local_26b0 + lVar32 * 4);
                    local_2480._4_4_ = uVar4;
                    local_2480._0_4_ = uVar4;
                    local_2480._8_4_ = uVar4;
                    local_2480._12_4_ = uVar4;
                    local_2480._16_4_ = uVar4;
                    local_2480._20_4_ = uVar4;
                    local_2480._24_4_ = uVar4;
                    local_2480._28_4_ = uVar4;
                    auVar65._4_4_ = uVar25;
                    auVar65._0_4_ = uVar25;
                    auVar65._8_4_ = uVar25;
                    auVar65._12_4_ = uVar25;
                    auVar66._16_4_ = uVar25;
                    auVar66._0_16_ = auVar65;
                    auVar66._20_4_ = uVar25;
                    auVar66._24_4_ = uVar25;
                    auVar66._28_4_ = uVar25;
                    local_24c0[0] = (RTCHitN)(char)uVar23;
                    local_24c0[1] = (RTCHitN)(char)((uint)uVar23 >> 8);
                    local_24c0[2] = (RTCHitN)(char)((uint)uVar23 >> 0x10);
                    local_24c0[3] = (RTCHitN)(char)((uint)uVar23 >> 0x18);
                    local_24c0[4] = (RTCHitN)(char)uVar23;
                    local_24c0[5] = (RTCHitN)(char)((uint)uVar23 >> 8);
                    local_24c0[6] = (RTCHitN)(char)((uint)uVar23 >> 0x10);
                    local_24c0[7] = (RTCHitN)(char)((uint)uVar23 >> 0x18);
                    local_24c0[8] = (RTCHitN)(char)uVar23;
                    local_24c0[9] = (RTCHitN)(char)((uint)uVar23 >> 8);
                    local_24c0[10] = (RTCHitN)(char)((uint)uVar23 >> 0x10);
                    local_24c0[0xb] = (RTCHitN)(char)((uint)uVar23 >> 0x18);
                    local_24c0[0xc] = (RTCHitN)(char)uVar23;
                    local_24c0[0xd] = (RTCHitN)(char)((uint)uVar23 >> 8);
                    local_24c0[0xe] = (RTCHitN)(char)((uint)uVar23 >> 0x10);
                    local_24c0[0xf] = (RTCHitN)(char)((uint)uVar23 >> 0x18);
                    local_24c0[0x10] = (RTCHitN)(char)uVar23;
                    local_24c0[0x11] = (RTCHitN)(char)((uint)uVar23 >> 8);
                    local_24c0[0x12] = (RTCHitN)(char)((uint)uVar23 >> 0x10);
                    local_24c0[0x13] = (RTCHitN)(char)((uint)uVar23 >> 0x18);
                    local_24c0[0x14] = (RTCHitN)(char)uVar23;
                    local_24c0[0x15] = (RTCHitN)(char)((uint)uVar23 >> 8);
                    local_24c0[0x16] = (RTCHitN)(char)((uint)uVar23 >> 0x10);
                    local_24c0[0x17] = (RTCHitN)(char)((uint)uVar23 >> 0x18);
                    local_24c0[0x18] = (RTCHitN)(char)uVar23;
                    local_24c0[0x19] = (RTCHitN)(char)((uint)uVar23 >> 8);
                    local_24c0[0x1a] = (RTCHitN)(char)((uint)uVar23 >> 0x10);
                    local_24c0[0x1b] = (RTCHitN)(char)((uint)uVar23 >> 0x18);
                    local_24c0[0x1c] = (RTCHitN)(char)uVar23;
                    local_24c0[0x1d] = (RTCHitN)(char)((uint)uVar23 >> 8);
                    local_24c0[0x1e] = (RTCHitN)(char)((uint)uVar23 >> 0x10);
                    local_24c0[0x1f] = (RTCHitN)(char)((uint)uVar23 >> 0x18);
                    uStack_243c = local_2440;
                    uStack_2438 = local_2440;
                    uStack_2434 = local_2440;
                    uStack_2430 = local_2440;
                    uStack_242c = local_2440;
                    uStack_2428 = local_2440;
                    uStack_2424 = local_2440;
                    local_2400 = auVar66;
                    vpcmpeqd_avx2(local_2460,local_2460);
                    uStack_23dc = context->user->instID[0];
                    local_23e0 = uStack_23dc;
                    uStack_23d8 = uStack_23dc;
                    uStack_23d4 = uStack_23dc;
                    uStack_23d0 = uStack_23dc;
                    uStack_23cc = uStack_23dc;
                    uStack_23c8 = uStack_23dc;
                    uStack_23c4 = uStack_23dc;
                    uStack_23bc = context->user->instPrimID[0];
                    local_23c0 = uStack_23bc;
                    uStack_23b8 = uStack_23bc;
                    uStack_23b4 = uStack_23bc;
                    uStack_23b0 = uStack_23bc;
                    uStack_23ac = uStack_23bc;
                    uStack_23a8 = uStack_23bc;
                    uStack_23a4 = uStack_23bc;
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_26e0 + lVar32 * 4);
                    local_26a0 = local_2600;
                    local_27b0.valid = (int *)local_26a0;
                    local_27b0.geometryUserPtr = *(void **)(lVar28 + 0x18);
                    local_27b0.context = context->user;
                    local_27b0.hit = local_24c0;
                    local_27b0.N = 8;
                    local_27b0.ray = (RTCRayN *)ray;
                    if (*(code **)(lVar28 + 0x40) != (code *)0x0) {
                      local_2820._0_8_ = lVar35;
                      local_2830 = auVar88._0_16_;
                      local_2840 = auVar93._0_16_;
                      auVar66 = ZEXT1632(auVar65);
                      (**(code **)(lVar28 + 0x40))(&local_27b0);
                      auVar93 = ZEXT1664(local_2840);
                      auVar88 = ZEXT1664(local_2830);
                      k = local_27d8;
                      uVar33 = local_2868;
                      ray = local_27d0;
                      lVar35 = local_2820._0_8_;
                    }
                    auVar18 = vpcmpeqd_avx2(local_26a0,_DAT_01faff00);
                    auVar67 = vpcmpeqd_avx2(auVar66,auVar66);
                    auVar56 = auVar67 & ~auVar18;
                    if ((((((((auVar56 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar56 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar56 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar56 >> 0x7f,0) == '\0') &&
                          (auVar56 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar56 >> 0xbf,0) == '\0') &&
                        (auVar56 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar56[0x1f]) {
                      auVar18 = auVar18 ^ auVar67;
                    }
                    else {
                      p_Var7 = context->args->filter;
                      if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_2850._0_8_ + 0x3e) & 0x40) != 0)))) {
                        local_2820._0_8_ = lVar35;
                        local_2830 = auVar88._0_16_;
                        local_2840 = auVar93._0_16_;
                        auVar67 = ZEXT1632(auVar67._0_16_);
                        (*p_Var7)(&local_27b0);
                        auVar93 = ZEXT1664(local_2840);
                        auVar88 = ZEXT1664(local_2830);
                        k = local_27d8;
                        uVar33 = local_2868;
                        ray = local_27d0;
                        lVar35 = local_2820._0_8_;
                      }
                      auVar17 = vpcmpeqd_avx2(local_26a0,_DAT_01faff00);
                      auVar67 = vpcmpeqd_avx2(auVar67,auVar67);
                      auVar18 = auVar17 ^ auVar67;
                      auVar56 = auVar67 & ~auVar17;
                      if ((((((((auVar56 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar56 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar56 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar56 >> 0x7f,0) != '\0') ||
                            (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar56 >> 0xbf,0) != '\0') ||
                          (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar56[0x1f] < '\0') {
                        auVar57._0_4_ = auVar17._0_4_ ^ auVar67._0_4_;
                        auVar57._4_4_ = auVar17._4_4_ ^ auVar67._4_4_;
                        auVar57._8_4_ = auVar17._8_4_ ^ auVar67._8_4_;
                        auVar57._12_4_ = auVar17._12_4_ ^ auVar67._12_4_;
                        auVar57._16_4_ = auVar17._16_4_ ^ auVar67._16_4_;
                        auVar57._20_4_ = auVar17._20_4_ ^ auVar67._20_4_;
                        auVar57._24_4_ = auVar17._24_4_ ^ auVar67._24_4_;
                        auVar57._28_4_ = auVar17._28_4_ ^ auVar67._28_4_;
                        auVar56 = vmaskmovps_avx(auVar57,*(undefined1 (*) [32])local_27b0.hit);
                        *(undefined1 (*) [32])(local_27b0.ray + 0x180) = auVar56;
                        auVar56 = vmaskmovps_avx(auVar57,*(undefined1 (*) [32])
                                                          (local_27b0.hit + 0x20));
                        *(undefined1 (*) [32])(local_27b0.ray + 0x1a0) = auVar56;
                        auVar56 = vmaskmovps_avx(auVar57,*(undefined1 (*) [32])
                                                          (local_27b0.hit + 0x40));
                        *(undefined1 (*) [32])(local_27b0.ray + 0x1c0) = auVar56;
                        auVar56 = vmaskmovps_avx(auVar57,*(undefined1 (*) [32])
                                                          (local_27b0.hit + 0x60));
                        *(undefined1 (*) [32])(local_27b0.ray + 0x1e0) = auVar56;
                        auVar56 = vmaskmovps_avx(auVar57,*(undefined1 (*) [32])
                                                          (local_27b0.hit + 0x80));
                        *(undefined1 (*) [32])(local_27b0.ray + 0x200) = auVar56;
                        auVar56 = vpmaskmovd_avx2(auVar57,*(undefined1 (*) [32])
                                                           (local_27b0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_27b0.ray + 0x220) = auVar56;
                        auVar56 = vpmaskmovd_avx2(auVar57,*(undefined1 (*) [32])
                                                           (local_27b0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_27b0.ray + 0x240) = auVar56;
                        auVar56 = vpmaskmovd_avx2(auVar57,*(undefined1 (*) [32])
                                                           (local_27b0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_27b0.ray + 0x260) = auVar56;
                        auVar56 = vpmaskmovd_avx2(auVar57,*(undefined1 (*) [32])
                                                           (local_27b0.hit + 0x100));
                        *(undefined1 (*) [32])(local_27b0.ray + 0x280) = auVar56;
                      }
                    }
                    if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar18 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar18 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar18 >> 0x7f,0) == '\0') &&
                          (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar18 >> 0xbf,0) == '\0') &&
                        (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar18[0x1f]) {
                      *(int *)(ray + k * 4 + 0x100) = auVar93._0_4_;
                    }
                    else {
                      auVar93 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                    }
                    *(undefined4 *)(local_27f0 + local_2810._0_8_ * 4) = 0;
                    uVar23 = auVar93._0_4_;
                    auVar45._4_4_ = uVar23;
                    auVar45._0_4_ = uVar23;
                    auVar45._8_4_ = uVar23;
                    auVar45._12_4_ = uVar23;
                    auVar47 = vcmpps_avx(auVar88._0_16_,auVar45,2);
                    local_27f0 = vandps_avx(auVar47,local_27f0);
                    uVar34 = local_2810._0_8_;
                    lVar28 = local_2860;
                  }
                  if ((((local_27f0 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_27f0 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_27f0 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_27f0[0xf]) break;
                  auVar55._8_4_ = 0x7f800000;
                  auVar55._0_8_ = 0x7f8000007f800000;
                  auVar55._12_4_ = 0x7f800000;
                  auVar47 = vblendvps_avx(auVar55,auVar88._0_16_,local_27f0);
                  auVar58 = vshufps_avx(auVar47,auVar47,0xb1);
                  auVar58 = vminps_avx(auVar58,auVar47);
                  auVar68 = vshufpd_avx(auVar58,auVar58,1);
                  auVar58 = vminps_avx(auVar68,auVar58);
                  auVar58 = vcmpps_avx(auVar47,auVar58,0);
                  auVar68 = local_27f0 & auVar58;
                  auVar47 = local_27f0;
                  if ((((auVar68 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar68 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar68 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar68[0xf] < '\0') {
                    auVar47 = vandps_avx(auVar58,local_27f0);
                  }
                  uVar23 = vmovmskps_avx(auVar47);
                  lVar32 = 0;
                  for (uVar34 = CONCAT44((int)(uVar34 >> 0x20),uVar23); (uVar34 & 1) == 0;
                      uVar34 = uVar34 >> 1 | 0x8000000000000000) {
                    lVar32 = lVar32 + 1;
                  }
                } while( true );
              }
            }
          }
          lVar35 = lVar35 + 1;
        } while (lVar35 != local_27c8);
      }
      uVar23 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar46 = ZEXT3264(CONCAT428(uVar23,CONCAT424(uVar23,CONCAT420(uVar23,CONCAT416(uVar23,
                                                  CONCAT412(uVar23,CONCAT48(uVar23,CONCAT44(uVar23,
                                                  uVar23))))))));
      auVar88 = ZEXT3264(local_24e0);
      auVar93 = ZEXT3264(local_2500);
      auVar95 = ZEXT3264(local_2520);
      auVar97 = ZEXT3264(local_2540);
      auVar101 = ZEXT3264(local_2560);
      auVar102 = ZEXT3264(local_2580);
      auVar103 = ZEXT3264(local_25a0);
      auVar105 = ZEXT3264(local_25c0);
      auVar107 = ZEXT3264(local_25e0);
      auVar111 = ZEXT3264(local_2780);
    }
    if (pauVar24 == (undefined1 (*) [16])&local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }